

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O1

int TestConfigExDataIndex(void)

{
  int iVar1;
  anon_class_1_0_00000001 *this;
  
  if (TestConfigExDataIndex()::index == '\0') {
    this = (anon_class_1_0_00000001 *)&TestConfigExDataIndex()::index;
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      TestConfigExDataIndex::index =
           TestConfigExDataIndex::anon_class_1_0_00000001::operator()(this);
      __cxa_guard_release(&TestConfigExDataIndex()::index);
    }
  }
  return TestConfigExDataIndex::index;
}

Assistant:

static int TestConfigExDataIndex() {
  static int index = [&] {
    OPENSSL_disable_malloc_failures_for_testing();
    int ret = SSL_get_ex_new_index(0, nullptr, nullptr, nullptr, nullptr);
    BSSL_CHECK(ret >= 0);
    OPENSSL_enable_malloc_failures_for_testing();
    return ret;
  }();
  return index;
}